

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

Bits __thiscall
OPL::DOSBox::DBOPL::Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)2>(Operator *this)

{
  Bit32s BVar1;
  Bit32s change;
  Bit32s vol;
  Operator *this_local;
  
  this_local._4_4_ = this->volume;
  if ((this->reg20 & 0x20) == 0) {
    BVar1 = RateForward(this,this->releaseAdd);
    this_local._4_4_ = BVar1 + this_local._4_4_;
    if (this_local._4_4_ < 0x1ff) {
      this->volume = this_local._4_4_;
    }
    else {
      this->volume = 0x1ff;
      SetState(this,'\0');
      this_local._4_4_ = 0x1ff;
    }
  }
  return this_local._4_4_;
}

Assistant:

Bits Operator::TemplateVolume(  ) {
	Bit32s vol = volume;
	Bit32s change;
	switch ( yes ) {
	case OFF:
		return ENV_MAX;
	case ATTACK:
		change = RateForward( attackAdd );
		if ( !change )
			return vol;
		vol += ( (~vol) * change ) >> 3;
		if ( vol < ENV_MIN ) {
			volume = ENV_MIN;
			rateIndex = 0;
			SetState( DECAY );
			return ENV_MIN;
		}
		break;
	case DECAY:
		vol += RateForward( decayAdd );
		if ( GCC_UNLIKELY(vol >= sustainLevel) ) {
			//Check if we didn't overshoot max attenuation, then just go off
			if ( GCC_UNLIKELY(vol >= ENV_MAX) ) {
				volume = ENV_MAX;
				SetState( OFF );
				return ENV_MAX;
			}
			//Continue as sustain
			rateIndex = 0;
			SetState( SUSTAIN );
		}
		break;
	case SUSTAIN:
		if ( reg20 & MASK_SUSTAIN ) {
			return vol;
		}
		//In sustain phase, but not sustaining, do regular release
	case RELEASE:
		vol += RateForward( releaseAdd );
		if ( GCC_UNLIKELY(vol >= ENV_MAX) ) {
			volume = ENV_MAX;
			SetState( OFF );
			return ENV_MAX;
		}
		break;
	}
	volume = vol;
	return vol;
}